

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O3

void duckdb::StructStats::Deserialize(Deserializer *deserializer,BaseStatistics *base)

{
  _Elt_pointer prVar1;
  int iVar2;
  child_list_t<LogicalType> *this;
  undefined4 extraout_var;
  const_reference pvVar3;
  size_type __n;
  long lVar4;
  BaseStatistics val;
  BaseStatistics local_88;
  
  this = StructType::GetChildTypes_abi_cxx11_(&base->type);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"child_stats");
  iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    lVar4 = 0;
    __n = 0;
    do {
      pvVar3 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](this,__n);
      prVar1 = (deserializer->data).types.c.
               super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (prVar1 == (deserializer->data).types.c.
                    super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        ::std::
        deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
        ::_M_push_back_aux<duckdb::LogicalType_const&>
                  ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                    *)&(deserializer->data).types,&pvVar3->second);
      }
      else {
        prVar1->_M_data = &pvVar3->second;
        (deserializer->data).types.c.
        super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = prVar1 + 1;
      }
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      BaseStatistics::Deserialize(&local_88,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      BaseStatistics::Copy
                ((BaseStatistics *)
                 (&(((base->child_stats).
                     super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                     .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl)->type).
                   id_ + lVar4),&local_88);
      Deserializer::Unset<duckdb::LogicalType>(deserializer);
      BaseStatistics::~BaseStatistics(&local_88);
      __n = __n + 1;
      lVar4 = lVar4 + 0x58;
    } while (CONCAT44(extraout_var,iVar2) != __n);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return;
}

Assistant:

void StructStats::Deserialize(Deserializer &deserializer, BaseStatistics &base) {
	auto &type = base.GetType();
	D_ASSERT(type.InternalType() == PhysicalType::STRUCT);

	auto &child_types = StructType::GetChildTypes(type);

	deserializer.ReadList(200, "child_stats", [&](Deserializer::List &list, idx_t i) {
		deserializer.Set<const LogicalType &>(child_types[i].second);
		auto stat = list.ReadElement<BaseStatistics>();
		base.child_stats[i].Copy(stat);
		deserializer.Unset<LogicalType>();
	});
}